

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

uint64_t __thiscall llvm::APInt::urem(APInt *this,uint64_t RHS)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint64_t RHS_local;
  uint64_t Remainder;
  
  RHS_local = RHS;
  if (RHS == 0) {
    __assert_fail("RHS != 0 && \"Remainder by zero?\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x67e,"uint64_t llvm::APInt::urem(uint64_t) const");
  }
  if (this->BitWidth < 0x41) {
    uVar3 = (this->U).VAL;
LAB_00186f1e:
    uVar4 = uVar3 % RHS;
  }
  else {
    uVar2 = getActiveBits(this);
    if (RHS != 1 && uVar2 != 0) {
      bVar1 = ult(this,RHS);
      if (bVar1) {
        uVar4 = getZExtValue(this);
        return uVar4;
      }
      bVar1 = operator==(this,RHS);
      if (!bVar1) {
        uVar2 = (uint)((ulong)uVar2 + 0x3f >> 6);
        if (uVar2 != 1) {
          divide((this->U).pVal,uVar2,&RHS_local,1,(WordType *)0x0,&Remainder);
          return Remainder;
        }
        uVar3 = *(this->U).pVal;
        goto LAB_00186f1e;
      }
    }
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

uint64_t APInt::urem(uint64_t RHS) const {
  assert(RHS != 0 && "Remainder by zero?");

  if (isSingleWord())
    return U.VAL % RHS;

  // Get some facts about the LHS
  unsigned lhsWords = getNumWords(getActiveBits());

  // Check the degenerate cases
  if (lhsWords == 0)
    // 0 % Y ===> 0
    return 0;
  if (RHS == 1)
    // X % 1 ===> 0
    return 0;
  if (this->ult(RHS))
    // X % Y ===> X, iff X < Y
    return getZExtValue();
  if (*this == RHS)
    // X % X == 0;
    return 0;
  if (lhsWords == 1)
    // All high words are zero, just use native remainder
    return U.pVal[0] % RHS;

  // We have to compute it the hard way. Invoke the Knuth divide algorithm.
  uint64_t Remainder;
  divide(U.pVal, lhsWords, &RHS, 1, nullptr, &Remainder);
  return Remainder;
}